

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall cnn::Pow::dim_forward(Pow *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *os;
  invalid_argument *this_00;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  __off_t __length;
  __off_t __length_00;
  Dim *in_RDI;
  ostringstream s;
  Dim *in_stack_fffffffffffffdd0;
  ostringstream *this_01;
  string local_200 [48];
  ostringstream local_1d0 [376];
  Dim local_58 [2];
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  local_10 = in_RDX;
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar2 != 2) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x2b7,"virtual Dim cnn::Pow::dim_forward(const vector<Dim> &) const");
  }
  pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  Dim::truncate(in_RDI,(char *)pvVar3,__length);
  pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
  Dim::truncate(local_58,(char *)pvVar3,__length_00);
  Dim::single_batch(in_stack_fffffffffffffdd0);
  uVar1 = Dim::size(in_stack_fffffffffffffdd0);
  if (uVar1 != 1) {
    this_01 = local_1d0;
    std::__cxx11::ostringstream::ostringstream(this_01);
    os = std::operator<<((ostream *)this_01,"Bad input dimensions in Pow: ");
    cnn::operator<<(os,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)this_01);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_200);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return in_RDI;
}

Assistant:

Dim Pow::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 2);
  Dim d = xs[0].truncate();
  if (xs[1].truncate().single_batch().size() != 1) {
    ostringstream s; s << "Bad input dimensions in Pow: " << xs;
    throw std::invalid_argument(s.str());
  }
  return d;
}